

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  ushort uVar1;
  int iVar2;
  stbi__uint16 *__ptr;
  undefined8 *puVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ushort *puVar9;
  stbi__uint16 *psVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ushort *puVar14;
  undefined1 auVar15 [16];
  
  if (req_comp != img_n) {
    __ptr = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (__ptr == (stbi__uint16 *)0x0) {
      free(data);
      puVar3 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
      pcVar5 = "outofmem";
LAB_0013d3cb:
      *puVar3 = pcVar5;
      data = (stbi__uint16 *)0x0;
    }
    else {
      iVar2 = req_comp + img_n * 8;
      uVar4 = 0;
      if ((int)y < 1) {
        y = 0;
      }
      iVar6 = x - 1;
      uVar12 = 0;
      for (uVar13 = 0; uVar13 != y; uVar13 = uVar13 + 1) {
        if (0x19 < iVar2 - 10U) {
switchD_0013d13d_caseD_d:
          free(data);
          free(__ptr);
          puVar3 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
          pcVar5 = "unsupported";
          goto LAB_0013d3cb;
        }
        uVar11 = (ulong)uVar4;
        iVar7 = (int)uVar13 * x;
        puVar14 = data + (uint)(iVar7 * img_n);
        psVar10 = __ptr + (uint)(iVar7 * req_comp);
        switch(iVar2) {
        case 10:
          lVar8 = 0;
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            __ptr[uVar11 + lVar8] = *(stbi__uint16 *)((long)data + lVar8 + uVar12 * 2);
            __ptr[uVar11 + lVar8 + 1] = 0xffff;
            lVar8 = lVar8 + 2;
          }
          break;
        case 0xb:
          puVar9 = __ptr + uVar11 + 2;
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            uVar1 = *puVar14;
            *puVar9 = uVar1;
            puVar9[-1] = uVar1;
            puVar9[-2] = uVar1;
            puVar14 = puVar14 + 1;
            puVar9 = puVar9 + 3;
          }
          break;
        case 0xc:
          lVar8 = 0;
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            auVar15._8_8_ = 0;
            auVar15._0_8_ = (ulong)*(ushort *)((long)data + lVar8 + uVar12 * 2) | 0xffff0000;
            auVar15 = pshuflw(auVar15,auVar15,0x40);
            *(long *)(__ptr + uVar11 + lVar8 * 2) = auVar15._0_8_;
            lVar8 = lVar8 + 2;
          }
          break;
        default:
          goto switchD_0013d13d_caseD_d;
        case 0x11:
          lVar8 = 0;
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            *(stbi__uint16 *)((long)__ptr + lVar8 + uVar11 * 2) = data[uVar12 + lVar8];
            lVar8 = lVar8 + 2;
          }
          break;
        case 0x13:
          puVar9 = __ptr + uVar11 + 2;
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            uVar1 = *puVar14;
            *puVar9 = uVar1;
            puVar9[-1] = uVar1;
            puVar9[-2] = uVar1;
            puVar14 = puVar14 + 2;
            puVar9 = puVar9 + 3;
          }
          break;
        case 0x14:
          lVar8 = 0;
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            auVar15 = ZEXT416(*(uint *)((long)data + lVar8 + uVar12 * 2));
            auVar15 = pshuflw(auVar15,auVar15,0x40);
            *(long *)(__ptr + uVar11 + lVar8) = auVar15._0_8_;
            lVar8 = lVar8 + 4;
          }
          break;
        case 0x19:
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            *psVar10 = (stbi__uint16)
                       ((uint)puVar14[2] * 0x1d + (uint)puVar14[1] * 0x96 + (uint)*puVar14 * 0x4d >>
                       8);
            puVar14 = puVar14 + 3;
            psVar10 = psVar10 + 1;
          }
          break;
        case 0x1a:
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            *psVar10 = (stbi__uint16)
                       ((uint)puVar14[2] * 0x1d + (uint)puVar14[1] * 0x96 + (uint)*puVar14 * 0x4d >>
                       8);
            psVar10[1] = 0xffff;
            puVar14 = puVar14 + 3;
            psVar10 = psVar10 + 2;
          }
          break;
        case 0x1c:
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            *(undefined4 *)psVar10 = *(undefined4 *)puVar14;
            psVar10[2] = puVar14[2];
            psVar10[3] = 0xffff;
            puVar14 = puVar14 + 3;
            psVar10 = psVar10 + 4;
          }
          break;
        case 0x21:
          lVar8 = 0;
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            *(short *)((long)__ptr + lVar8 + uVar11 * 2) =
                 (short)((uint)data[uVar12 + lVar8 * 2 + 2] * 0x1d +
                         (uint)data[uVar12 + lVar8 * 2 + 1] * 0x96 +
                         (uint)data[uVar12 + lVar8 * 2] * 0x4d >> 8);
            lVar8 = lVar8 + 2;
          }
          break;
        case 0x22:
          lVar8 = 0;
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            *(short *)((long)__ptr + lVar8 + uVar11 * 2) =
                 (short)((uint)data[uVar12 + lVar8 + 2] * 0x1d +
                         (uint)data[uVar12 + lVar8 + 1] * 0x96 + (uint)data[uVar12 + lVar8] * 0x4d
                        >> 8);
            *(stbi__uint16 *)((long)__ptr + lVar8 + uVar11 * 2 + 2) = data[uVar12 + lVar8 + 3];
            lVar8 = lVar8 + 4;
          }
          break;
        case 0x23:
          for (iVar7 = iVar6; -1 < iVar7; iVar7 = iVar7 + -1) {
            *(undefined4 *)psVar10 = *(undefined4 *)puVar14;
            psVar10[2] = puVar14[2];
            puVar14 = puVar14 + 4;
            psVar10 = psVar10 + 3;
          }
        }
        uVar12 = (ulong)((int)uVar12 + x * img_n);
        uVar4 = uVar4 + req_comp * x;
      }
      free(data);
      data = __ptr;
    }
  }
  return data;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}